

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cpp
# Opt level: O1

void __thiscall sf2cute::SoundFontWriter::Write(SoundFontWriter *this,ostream *out)

{
  vector<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>,std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>>>
  *this_00;
  pointer *__ptr;
  RIFF riff;
  _Head_base<0UL,_sf2cute::RIFFChunkInterface_*,_false> local_88;
  string local_80;
  undefined1 local_60 [64];
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"sfbk","");
  RIFF::RIFF((RIFF *)local_60,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  MakeInfoListChunk((SoundFontWriter *)&local_88);
  this_00 = (vector<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>,std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>>>
             *)(local_60 + 0x28);
  std::
  vector<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>,std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>>>
  ::
  emplace_back<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>>
            (this_00,(unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                      *)&local_88);
  if (local_88._M_head_impl != (RIFFChunkInterface *)0x0) {
    (*(local_88._M_head_impl)->_vptr_RIFFChunkInterface[1])();
  }
  MakeSdtaListChunk((SoundFontWriter *)&local_88);
  std::
  vector<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>,std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>>>
  ::
  emplace_back<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>>
            (this_00,(unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                      *)&local_88);
  if (local_88._M_head_impl != (RIFFChunkInterface *)0x0) {
    (*(local_88._M_head_impl)->_vptr_RIFFChunkInterface[1])();
  }
  MakePdtaListChunk((SoundFontWriter *)&local_88);
  std::
  vector<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>,std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>>>
  ::
  emplace_back<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>>
            (this_00,(unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                      *)&local_88);
  if (local_88._M_head_impl != (RIFFChunkInterface *)0x0) {
    (*(local_88._M_head_impl)->_vptr_RIFFChunkInterface[1])();
  }
  RIFF::Write((RIFF *)local_60,out);
  RIFF::~RIFF((RIFF *)local_60);
  return;
}

Assistant:

void SoundFontWriter::Write(std::ostream & out) {
  RIFF riff("sfbk");
  riff.AddChunk(MakeInfoListChunk());
  riff.AddChunk(MakeSdtaListChunk());
  riff.AddChunk(MakePdtaListChunk());
  riff.Write(out);
}